

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  float fVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImGuiContext *pIVar4;
  ImU32 col_00;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar4 = GImGui;
  fVar10 = (bb->Min).x;
  fVar1 = (bb->Min).y;
  fVar9 = (GImGui->Style).TabRounding;
  fVar8 = ((bb->Max).x - fVar10) * 0.5 + -1.0;
  if (fVar8 <= fVar9) {
    fVar9 = fVar8;
  }
  fVar8 = (bb->Max).y + -1.0;
  fVar9 = (float)(~-(uint)(fVar9 <= 0.0) & (uint)fVar9);
  iVar7 = (draw_list->_Path).Size;
  iVar2 = (draw_list->_Path).Capacity;
  local_48 = ZEXT416((uint)fVar9);
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      pIVar5 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
      pIVar3 = (draw_list->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar5;
      (draw_list->_Path).Capacity = iVar7;
      fVar9 = (float)local_48._0_4_;
    }
  }
  pIVar3 = (draw_list->_Path).Data;
  iVar7 = (draw_list->_Path).Size;
  pIVar3[iVar7].x = fVar10;
  pIVar3[iVar7].y = fVar8;
  (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
  local_50.x = (bb->Min).x + fVar9;
  fVar10 = fVar1 + 1.0 + fVar9;
  local_50.y = fVar10;
  ImDrawList::PathArcToFast(draw_list,&local_50,fVar9,6,9);
  local_50.x = (bb->Max).x - (float)local_48._0_4_;
  local_50.y = fVar10;
  ImDrawList::PathArcToFast(draw_list,&local_50,(float)local_48._0_4_,9,0xc);
  fVar10 = (bb->Max).x;
  iVar7 = (draw_list->_Path).Size;
  iVar2 = (draw_list->_Path).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      pIVar5 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
      pIVar3 = (draw_list->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar5;
      (draw_list->_Path).Capacity = iVar7;
    }
  }
  pIVar3 = (draw_list->_Path).Data;
  iVar7 = (draw_list->_Path).Size;
  pIVar3[iVar7].x = fVar10;
  pIVar3[iVar7].y = fVar8;
  iVar7 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar7;
  ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,iVar7,col);
  if (0.0 < (pIVar4->Style).TabBorderSize) {
    pIVar3 = (draw_list->_Path).Data;
    iVar7 = (draw_list->_Path).Size;
    col_00 = GetColorU32(5,1.0);
    ImDrawList::AddPolyline(draw_list,pIVar3,iVar7,col_00,false,(pIVar4->Style).TabBorderSize);
  }
  (draw_list->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    (void)flags;
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    float y1 = bb.Min.y + 1.0f;
    float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->AddConvexPolyFilled(draw_list->_Path.Data, draw_list->_Path.Size, col);
    if (g.Style.TabBorderSize > 0.0f)
        draw_list->AddPolyline(draw_list->_Path.Data, draw_list->_Path.Size, GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    draw_list->PathClear();
}